

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O1

int cost_mv_ref(ModeCosts *mode_costs,PREDICTION_MODE mode,int16_t mode_context)

{
  int iVar1;
  uint uVar2;
  
  if ((byte)(mode - 0x11) < 8) {
    return mode_costs->inter_compound_mode_cost[mode_context][(byte)(mode - 0x11)];
  }
  if (mode == '\x10') {
    return mode_costs->newmv_mode_cost[(ushort)mode_context & 7][0];
  }
  iVar1 = mode_costs->newmv_mode_cost[(ushort)mode_context & 7][1];
  uVar2 = (ushort)mode_context >> 3 & 1;
  if (mode == '\x0f') {
    return iVar1 + mode_costs->zeromv_mode_cost[uVar2][0];
  }
  return iVar1 + mode_costs->zeromv_mode_cost[uVar2][1] +
         mode_costs->refmv_mode_cost[(ushort)mode_context >> 4 & 0xf][mode != '\r'];
}

Assistant:

static inline int is_inter_compound_mode(PREDICTION_MODE mode) {
  return mode >= COMP_INTER_MODE_START && mode < COMP_INTER_MODE_END;
}